

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingPreparedStatement
          (ClientContext *this,ClientContextLock *lock,string *query,
          shared_ptr<duckdb::PreparedStatementData,_true> *prepared,
          PendingQueryParameters *parameters)

{
  _Head_base<0UL,_duckdb::PendingQueryResult_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  type pPVar4;
  PreparedStatementData *this_00;
  pointer this_01;
  ClientContextState *pCVar5;
  shared_ptr<duckdb::PreparedStatementData,_true> *extraout_RDX;
  shared_ptr<duckdb::PreparedStatementData,_true> *extraout_RDX_00;
  shared_ptr<duckdb::PreparedStatementData,_true> *statement_p;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  PendingQueryParameters *in_R9;
  PreparedStatementCallbackInfo info;
  undefined1 local_78 [16];
  string *local_68;
  _Head_base<0UL,_duckdb::PendingQueryResult_*,_false> local_60;
  type local_58 [2];
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  local_48;
  
  local_68 = (string *)prepared;
  local_60._M_head_impl = (PendingQueryResult *)this;
  pPVar4 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)parameters);
  CheckIfPreparedStatementIsExecutable((ClientContext *)lock,pPVar4);
  this_00 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                      ((shared_ptr<duckdb::PreparedStatementData,_true> *)parameters);
  bVar2 = PreparedStatementData::RequireRebind
                    (this_00,(ClientContext *)lock,(in_R9->parameters).ptr);
  this_01 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
            ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                          *)(lock + 5));
  RegisteredStateManager::States
            ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)&local_48,this_01
            );
  if (local_48.
      super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_58[0] = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                              ((shared_ptr<duckdb::PreparedStatementData,_true> *)parameters);
      pCVar5 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                         (local_48.
                          super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      this_01 = (pointer)lock;
      iVar3 = (**(code **)(*(long *)pCVar5 + 0x68))(pCVar5,lock,local_58,bVar2);
      if (iVar3 == 1) {
        bVar2 = true;
      }
      local_48.
      super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    } while (local_48.
             super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_48.
             super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    bVar2 = bVar2 == true;
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  ::~vector(&local_48);
  statement_p = extraout_RDX;
  if (bVar2 != false) {
    RebindPreparedStatement
              ((ClientContext *)lock,(ClientContextLock *)this_01,local_68,
               (shared_ptr<duckdb::PreparedStatementData,_true> *)parameters,in_R9);
    pPVar4 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                       ((shared_ptr<duckdb::PreparedStatementData,_true> *)parameters);
    CheckIfPreparedStatementIsExecutable((ClientContext *)lock,pPVar4);
    statement_p = extraout_RDX_00;
  }
  _Var1._M_head_impl = local_60._M_head_impl;
  local_78._0_8_ = (parameters->parameters).ptr;
  local_78._8_8_ = *(undefined8 *)&parameters->allow_stream_result;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count + 1;
    }
  }
  PendingPreparedStatementInternal
            ((ClientContext *)local_60._M_head_impl,lock,statement_p,
             (PendingQueryParameters *)local_78);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (__uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
          )_Var1._M_head_impl;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingPreparedStatement(ClientContextLock &lock, const string &query,
                                                                       shared_ptr<PreparedStatementData> prepared,
                                                                       const PendingQueryParameters &parameters) {
	CheckIfPreparedStatementIsExecutable(*prepared);

	RebindQueryInfo rebind = RebindQueryInfo::DO_NOT_REBIND;
	if (prepared->RequireRebind(*this, parameters.parameters)) {
		rebind = RebindQueryInfo::ATTEMPT_TO_REBIND;
	}

	for (auto &state : registered_state->States()) {
		PreparedStatementCallbackInfo info(*prepared, parameters);
		auto new_rebind = state->OnExecutePrepared(*this, info, rebind);
		if (new_rebind == RebindQueryInfo::ATTEMPT_TO_REBIND) {
			rebind = RebindQueryInfo::ATTEMPT_TO_REBIND;
		}
	}
	if (rebind == RebindQueryInfo::ATTEMPT_TO_REBIND) {
		RebindPreparedStatement(lock, query, prepared, parameters);
		CheckIfPreparedStatementIsExecutable(*prepared); // rerun this too as modified_databases might have changed
	}
	return PendingPreparedStatementInternal(lock, prepared, parameters);
}